

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  uint in_EAX;
  char *pcVar4;
  ulong extraout_RDX;
  ulong uVar5;
  uint uVar6;
  int i;
  long lVar7;
  long lVar8;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  pcVar4 = (char *)HasBitsSize(this);
  uStack_38 = (ulong)(uint)uStack_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(size_type)pcVar4,(value_type_conflict3 *)((long)&uStack_38 + 4)
             ,(allocator_type *)((long)&uStack_38 + 3));
  lVar8 = 0;
  uVar5 = extraout_RDX;
  for (lVar7 = 0; lVar7 < *(int *)(this->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    lVar3 = *(long *)(this->descriptor_ + 0x30);
    if (*(int *)(lVar3 + 0x4c + lVar8) == 2) {
      pcVar4 = FieldDescriptor::index((FieldDescriptor *)(lVar3 + lVar8),pcVar4,(int)uVar5);
      iVar2 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)pcVar4];
      uVar6 = 1 << ((byte)iVar2 & 0x1f);
      pcVar4 = (char *)(ulong)uVar6;
      uVar5 = (long)iVar2 % 0x20 & 0xffffffff;
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar2 / 0x20;
      *puVar1 = *puVar1 | uVar6;
    }
    lVar8 = lVar8 + 0xa8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32> masks(array_size, 0);

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |=
        static_cast<uint32>(1) << (has_bit_index % 32);
  }
  return masks;
}